

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

int __thiscall CInput::Update(CInput *this)

{
  char *dst;
  CEvent *pCVar1;
  int iVar2;
  int iVar3;
  void *source;
  long lVar4;
  ulong uVar5;
  undefined4 uVar6;
  char *pText;
  long in_FS_OFFSET;
  int NumKeyStates;
  SDL_Event Event;
  uint local_74;
  SDL_Event local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_InputCounter = this->m_InputCounter % 0xffff + 1;
  source = (void *)SDL_GetKeyboardState(&local_74);
  if (0x19a < (int)local_74) {
    local_74 = 0x19b;
  }
  mem_copy(this->m_aInputState,source,local_74);
  mem_zero(this->m_aInputState + (int)local_74,0x1da - local_74);
  UpdateMouseState(this);
  UpdateJoystickState(this);
  iVar2 = SDL_PollEvent(&local_70);
  if (iVar2 == 0) {
LAB_00129f31:
    iVar2 = 0;
    if (this->m_CompositionLength == 0) {
      this->m_CompositionLength = -1;
      iVar2 = 0;
    }
LAB_00129f46:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return iVar2;
  }
  dst = this->m_aComposition;
LAB_00129bc4:
  pText = local_70.edit.text;
  if (0x401 < (int)local_70.type) {
    if (0x601 < (int)local_70.type) {
      if (local_70.type - 0x603 < 2) {
        HandleJoystickButtonEvent(this,&local_70);
      }
      else if (local_70.type == 0x602) {
        HandleJoystickHatMotionEvent(this,&local_70);
      }
      goto switchD_00129d30_default;
    }
    if (local_70.type != 0x402) {
      if (local_70.type == 0x403) {
        uVar5 = 0x1a4;
        iVar2 = 3;
        if (local_70.window.data2 < 1) {
          if (-1 < local_70.window.data2) goto switchD_00129d30_default;
          uVar5 = 0x1a5;
          uVar6 = 0x1a5;
        }
        else {
          uVar6 = 0x1a4;
        }
        goto switchD_00129d30_caseD_3;
      }
      if (local_70.type == 0x600) {
        HandleJoystickAxisMotionEvent(this,&local_70);
      }
      goto switchD_00129d30_default;
    }
    iVar2 = 2;
LAB_00129d07:
    uVar5 = 0x19c;
    uVar6 = 0x19c;
    switch(local_70.key.keysym.scancode & (SDL_SCANCODE_LCTRL|SDL_SCANCODE_2)) {
    case 1:
      if ((local_70.key.keysym.scancode & 0x10000) == SDL_SCANCODE_UNKNOWN) {
        this->m_MouseDoubleClick = true;
      }
      else if (local_70.edit.text[6] == '\x01') {
        this->m_MouseDoubleClick = false;
      }
      uVar5 = 0x19b;
      uVar6 = 0x19b;
      break;
    case 2:
      uVar5 = 0x19d;
      uVar6 = 0x19d;
      break;
    case 3:
      break;
    case SDL_SCANCODE_A:
      uVar5 = 0x19e;
      uVar6 = 0x19e;
      break;
    case SDL_SCANCODE_B:
      uVar5 = 0x19f;
      uVar6 = 0x19f;
      break;
    case SDL_SCANCODE_C:
      uVar5 = 0x1a0;
      uVar6 = 0x1a0;
      break;
    case SDL_SCANCODE_D:
      uVar5 = 0x1a1;
      uVar6 = 0x1a1;
      break;
    case SDL_SCANCODE_E:
      uVar5 = 0x1a2;
      uVar6 = 0x1a2;
      break;
    case SDL_SCANCODE_F:
      uVar5 = 0x1a3;
      uVar6 = 0x1a3;
      break;
    default:
      goto switchD_00129d30_default;
    }
    goto switchD_00129d30_caseD_3;
  }
  iVar2 = 1;
  switch(local_70.type) {
  case 0x300:
    goto switchD_00129c26_caseD_300;
  case 0x301:
    iVar2 = 2;
    goto switchD_00129c26_caseD_300;
  case 0x302:
    iVar2 = str_length(pText);
    this->m_CompositionLength = iVar2;
    if (iVar2 == 0) {
      this->m_aComposition[0] = '\0';
      this->m_CompositionLength = 0;
      this->m_CompositionCursor = 0;
      this->m_CompositionSelectedLength = 0;
      break;
    }
    str_copy(dst,pText,0x20);
    this->m_CompositionCursor = 0;
    if (local_70.edit.start < 1) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      iVar3 = 0;
      do {
        iVar2 = str_utf8_forward(dst,iVar2);
        this->m_CompositionCursor = iVar2;
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_70.edit.start);
    }
    iVar3 = iVar2;
    if (0 < local_70.edit.length) {
      iVar3 = 0;
      do {
        iVar2 = str_utf8_forward(dst,iVar2);
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_70.edit.length);
      iVar3 = this->m_CompositionCursor;
    }
    this->m_CompositionSelectedLength = iVar2 - iVar3;
    iVar3 = (this->super_IEngineInput).super_IInput.m_NumEvents;
    lVar4 = (long)iVar3;
    if (lVar4 == 0x20) break;
    pCVar1 = (this->super_IEngineInput).super_IInput.m_aInputEvents + lVar4;
    pCVar1->m_Flags = 8;
    pCVar1->m_Key = 0;
    goto LAB_00129f05;
  case 0x303:
    this->m_aComposition[0] = '\0';
    this->m_CompositionLength = -1;
    this->m_CompositionCursor = 0;
    this->m_CompositionSelectedLength = 0;
    AddEvent(this,pText,0,8);
    break;
  default:
    if (local_70.type == 0x401) goto LAB_00129d07;
    if (local_70.type == 0x100) {
      iVar2 = 1;
      goto LAB_00129f46;
    }
  }
switchD_00129d30_default:
  iVar2 = SDL_PollEvent(&local_70);
  if (iVar2 == 0) goto LAB_00129f31;
  goto LAB_00129bc4;
switchD_00129c26_caseD_300:
  uVar6 = local_70.window.data2 + 0xc0000080;
  if (((uint)local_70.window.data2 >> 0x1e & 1) == 0) {
    uVar6 = local_70.window.data2;
  }
  if (-1 < (int)uVar6) {
    uVar5 = (ulong)local_70.key.keysym.scancode;
switchD_00129d30_caseD_3:
    iVar3 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[0x12])(this)
    ;
    if ((char)iVar3 == '\0') {
      if (((uint)uVar5 < 0x200 & (byte)iVar2 & (uint)uVar6 < 0x200) == 1) {
        this->m_aInputState[uVar5] = true;
        this->m_aInputCount[(uint)uVar6] = (unsigned_short)this->m_InputCounter;
      }
      iVar3 = (this->super_IEngineInput).super_IInput.m_NumEvents;
      lVar4 = (long)iVar3;
      if (lVar4 != 0x20) {
        (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar4].m_Key = uVar6;
        (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar4].m_Flags = iVar2;
LAB_00129f05:
        (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar4].m_aText[0] = '\0';
        (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar4].m_InputCount =
             this->m_InputCounter;
        (this->super_IEngineInput).super_IInput.m_NumEvents = iVar3 + 1;
      }
    }
  }
  goto switchD_00129d30_default;
}

Assistant:

int CInput::Update()
{
	// keep the counter between 1..0xFFFF, 0 means not pressed
	m_InputCounter = (m_InputCounter%0xFFFF)+1;

	int NumKeyStates;
	const Uint8 *pState = SDL_GetKeyboardState(&NumKeyStates);
	if(NumKeyStates >= KEY_MOUSE_1)
		NumKeyStates = KEY_MOUSE_1;
	mem_copy(m_aInputState, pState, NumKeyStates);
	mem_zero(m_aInputState+NumKeyStates, KEY_LAST-NumKeyStates);

	// these states must always be updated manually because they are not in the SDL_GetKeyboardState from SDL
	UpdateMouseState();
	UpdateJoystickState();

	SDL_Event Event;
	while(SDL_PollEvent(&Event))
	{
		int Key = -1;
		int Scancode = -1;
		int Action = IInput::FLAG_PRESS;
		switch(Event.type)
		{
			// handle text editing candidate
			case SDL_SYSWMEVENT:
				ProcessSystemMessage(Event.syswm.msg);
				break;

			// handle on the spot text editing
			case SDL_TEXTEDITING:
			{
				m_CompositionLength = str_length(Event.edit.text);
				if(m_CompositionLength)
				{
					str_copy(m_aComposition, Event.edit.text, sizeof(m_aComposition));
					m_CompositionCursor = 0;
					for(int i = 0; i < Event.edit.start; i++)
						m_CompositionCursor = str_utf8_forward(m_aComposition, m_CompositionCursor);
					int CompositionEnd = m_CompositionCursor;
					for(int i = 0; i < Event.edit.length; i++)
						CompositionEnd = str_utf8_forward(m_aComposition, CompositionEnd);
					m_CompositionSelectedLength = CompositionEnd - m_CompositionCursor;
					AddEvent(0, 0, IInput::FLAG_TEXT);
				}
				else
				{
					m_aComposition[0] = '\0';
					m_CompositionLength = 0;
					m_CompositionCursor = 0;
					m_CompositionSelectedLength = 0;
				}
				break;
			}
			case SDL_TEXTINPUT:
				m_aComposition[0] = 0;
				m_CompositionLength = COMP_LENGTH_INACTIVE;
				m_CompositionCursor = 0;
				m_CompositionSelectedLength = 0;
				AddEvent(Event.text.text, 0, IInput::FLAG_TEXT);
				break;

			// handle keys
			case SDL_KEYUP:
				Action = IInput::FLAG_RELEASE;

				// fall through
			case SDL_KEYDOWN:
				Key = KeycodeToKey(Event.key.keysym.sym);
				Scancode = Event.key.keysym.scancode;
				break;

			// handle the joystick events
			case SDL_JOYAXISMOTION:
				HandleJoystickAxisMotionEvent(Event);
				break;

			case SDL_JOYBUTTONUP:
			case SDL_JOYBUTTONDOWN:
				HandleJoystickButtonEvent(Event);
				break;

			case SDL_JOYHATMOTION:
				HandleJoystickHatMotionEvent(Event);
				break;

			// handle mouse buttons
			case SDL_MOUSEBUTTONUP:
				Action = IInput::FLAG_RELEASE;

				// fall through
			case SDL_MOUSEBUTTONDOWN:
				if(Event.button.button == SDL_BUTTON_LEFT) // ignore_convention
				{
					Key = KEY_MOUSE_1;
					if(Event.button.clicks%2 == 0)
						m_MouseDoubleClick = true;
					else if(Event.button.clicks == 1)
						m_MouseDoubleClick = false;
				}
				else if(Event.button.button == SDL_BUTTON_RIGHT) Key = KEY_MOUSE_2; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_MIDDLE) Key = KEY_MOUSE_3; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_X1) Key = KEY_MOUSE_4; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_X2) Key = KEY_MOUSE_5; // ignore_convention
				else if(Event.button.button == 6) Key = KEY_MOUSE_6; // ignore_convention
				else if(Event.button.button == 7) Key = KEY_MOUSE_7; // ignore_convention
				else if(Event.button.button == 8) Key = KEY_MOUSE_8; // ignore_convention
				else if(Event.button.button == 9) Key = KEY_MOUSE_9; // ignore_convention
				Scancode = Key;
				break;

			case SDL_MOUSEWHEEL:
				if(Event.wheel.y > 0) Key = KEY_MOUSE_WHEEL_UP; // ignore_convention
				else if(Event.wheel.y < 0) Key = KEY_MOUSE_WHEEL_DOWN; // ignore_convention
				else break;
				Action |= IInput::FLAG_RELEASE;
				Scancode = Key;
				break;

#if defined(CONF_PLATFORM_MACOSX)	// Todo SDL: remove this when fixed (mouse state is faulty on start)
			case SDL_WINDOWEVENT:
				if(Event.window.event == SDL_WINDOWEVENT_MAXIMIZED)
				{
					MouseModeAbsolute();
					MouseModeRelative();
				}
				break;
#endif

			// other messages
			case SDL_QUIT:
				return 1;
		}

		if(Key >= 0 && !HasComposition())
		{
			if((Action&IInput::FLAG_PRESS) && Key < g_MaxKeys && Scancode >= 0 && Scancode < g_MaxKeys)
			{
				m_aInputState[Scancode] = true;
				m_aInputCount[Key] = m_InputCounter;
			}
			AddEvent(0, Key, Action);
		}
	}

	if(m_CompositionLength == 0)
		m_CompositionLength = COMP_LENGTH_INACTIVE;

	return 0;
}